

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

work_t __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::getBoundsInv
          (Image<float,_gimage::PixelTraits<float>_> *this,long i,long k,int j)

{
  float fVar1;
  
  fVar1 = INFINITY;
  if ((((-1 < j) && (-1 < i)) && (j < this->depth)) &&
     (((-1 < k && (i < this->width)) && (k < this->height)))) {
    fVar1 = this->img[(uint)j][k][i];
  }
  return fVar1;
}

Assistant:

work_t getBoundsInv(long i, long k, int j=0) const
    {
      work_t ret=ptraits::invalid();

      if (j >= 0 && j < depth && i >= 0 && i < width && k >= 0 && k < height)
      {
        ret=static_cast<work_t>(img[j][k][i]);
      }

      return ret;
    }